

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O1

void set_kbd_iopointers(void)

{
  IOPAGE *pIVar1;
  
  pIVar1 = IOPage;
  EmMouseX68K = &IOPage->dlmousex;
  EmMouseY68K = &IOPage->dlmousey;
  EmCursorX68K = &IOPage->dlcursorx;
  EmCursorY68K = &IOPage->dlcursory;
  EmRealUtilin68K = &IOPage->dlutilin;
  EmUtilin68K = &InterfacePage->fakemousebits;
  EmKbdAd068K = &IOPage->dlkbdad0;
  EmKbdAd168K = &IOPage->dlkbdad1;
  EmKbdAd268K = &IOPage->dlkbdad2;
  EmKbdAd368K = &IOPage->dlkbdad3;
  EmKbdAd468K = &IOPage->dlkbdad4;
  EmKbdAd568K = &IOPage->dlkbdad5;
  EmDispInterrupt68K = &IOPage->dldispinterrupt;
  EmCursorBitMap68K = IOPage->dlcursorbitmap;
  IOPage->dlutilin = 0xffff;
  pIVar1->dlkbdad1 = 0xffff;
  pIVar1->dlkbdad0 = 0xffff;
  pIVar1->dlkbdad3 = 0xffff;
  pIVar1->dlkbdad2 = 0xffff;
  pIVar1->dlkbdad5 = 0xffff;
  pIVar1->dlkbdad4 = 0xffff;
  return;
}

Assistant:

void set_kbd_iopointers(void) {
  EmMouseX68K = (DLword *)&(IOPage->dlmousex);
  EmMouseY68K = (DLword *)&(IOPage->dlmousey);
  EmCursorX68K = (DLword *)&(IOPage->dlcursorx);
  EmCursorY68K = (DLword *)&(IOPage->dlcursory);
  EmRealUtilin68K = (DLword *)&(IOPage->dlutilin);
  /* EmUtilin68K is for KEYDOWNP1 macro or etc. */
  EmUtilin68K = (DLword *)&(InterfacePage->fakemousebits);
  EmKbdAd068K = (DLword *)&(IOPage->dlkbdad0);
  EmKbdAd168K = (DLword *)&(IOPage->dlkbdad1);
  EmKbdAd268K = (DLword *)&(IOPage->dlkbdad2);
  EmKbdAd368K = (DLword *)&(IOPage->dlkbdad3);
  EmKbdAd468K = (DLword *)&(IOPage->dlkbdad4);
  EmKbdAd568K = (DLword *)&(IOPage->dlkbdad5);
  EmDispInterrupt68K = (DLword *)&(IOPage->dldispinterrupt);
  EmCursorBitMap68K = (DLword *)(IOPage->dlcursorbitmap);

  *EmRealUtilin68K = KB_ALLUP;
  *EmKbdAd068K = KB_ALLUP;
  *EmKbdAd168K = KB_ALLUP;
  *EmKbdAd268K = KB_ALLUP;
  *EmKbdAd368K = KB_ALLUP;
  *EmKbdAd468K = KB_ALLUP;
  *EmKbdAd568K = KB_ALLUP;
}